

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateFieldAccessorDefinitions
          (MessageGenerator *this,Printer *p)

{
  Printer *pPVar1;
  bool bVar2;
  OneofDescriptor *pOVar3;
  FieldGenerator *this_00;
  Iterator IVar4;
  basic_string_view<char,_std::char_traits<char>_> local_190;
  basic_string_view<char,_std::char_traits<char>_> local_178;
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  local_168;
  Span<const_google::protobuf::io::Printer::Sub> local_150;
  undefined1 local_140 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  t;
  Span<const_google::protobuf::io::Printer::Sub> local_110;
  undefined1 local_100 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v;
  AccessorVerifier local_b0;
  AnyInvocable<void_(std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation)>
  local_98;
  undefined1 local_78 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:684:30)>
  accessor_verifier;
  value_type field;
  Iterator __end3;
  Iterator __begin3;
  FieldRangeImpl<google::protobuf::Descriptor> *__range3;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  Printer *local_18;
  Printer *p_local;
  MessageGenerator *this_local;
  
  local_18 = p;
  p_local = (Printer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,"// $classname$\n\n");
  protobuf::io::Printer::SourceLocation::current();
  protobuf::io::Printer::Emit(p,local_28._M_len,local_28._M_str);
  __begin3.descriptor =
       (Descriptor *)protobuf::internal::FieldRange<google::protobuf::Descriptor>(this->descriptor_)
  ;
  IVar4 = protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::begin
                    ((FieldRangeImpl<google::protobuf::Descriptor> *)&__begin3.descriptor);
  __begin3._0_8_ = IVar4.descriptor;
  __end3.descriptor._0_4_ = IVar4.idx;
  IVar4 = protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::end
                    ((FieldRangeImpl<google::protobuf::Descriptor> *)&__begin3.descriptor);
  __end3._0_8_ = IVar4.descriptor;
  field._0_4_ = IVar4.idx;
  while (bVar2 = protobuf::internal::operator!=((Iterator *)&__end3.descriptor,(Iterator *)&field),
        bVar2) {
    accessor_verifier.storage_.callback_buffer_ =
         (char  [8])
         protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator*
                   ((Iterator *)&__end3.descriptor);
    pPVar1 = local_18;
    cpp::anon_unknown_0::AccessorVerifier::AccessorVerifier
              (&local_b0,(FieldDescriptor *)accessor_verifier.storage_.callback_buffer_);
    absl::lts_20250127::
    AnyInvocable<void(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::io::Printer::SourceLocation)>
    ::AnyInvocable<google::protobuf::compiler::cpp::(anonymous_namespace)::AccessorVerifier,void>
              ((AnyInvocable<void(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::io::Printer::SourceLocation)>
                *)&local_98,&local_b0);
    protobuf::io::Printer::WithSubstitutionListener
              ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:684:30)>
                *)local_78,pPVar1,&local_98);
    absl::lts_20250127::
    AnyInvocable<void_(std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation)>
    ::~AnyInvocable(&local_98);
    cpp::anon_unknown_0::AccessorVerifier::~AccessorVerifier(&local_b0);
    Formatter::Formatter((Formatter *)(v.storage_.callback_buffer_ + 8),local_18);
    PrintFieldComment<google::protobuf::FieldDescriptor>
              ((Formatter *)(v.storage_.callback_buffer_ + 8),
               (FieldDescriptor *)accessor_verifier.storage_.callback_buffer_,&this->options_);
    Formatter::~Formatter((Formatter *)(v.storage_.callback_buffer_ + 8));
    pPVar1 = local_18;
    FieldVars((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
               *)(t.storage_.callback_buffer_ + 8),
              (FieldDescriptor *)accessor_verifier.storage_.callback_buffer_,&this->options_);
    absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
    Span<std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,void,std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,int>
              ((Span<google::protobuf::io::Printer::Sub_const> *)&local_110,
               (vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                *)(t.storage_.callback_buffer_ + 8));
    protobuf::io::Printer::WithVars
              ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
                *)local_100,pPVar1,local_110);
    std::
    vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ::~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
               *)(t.storage_.callback_buffer_ + 8));
    pPVar1 = local_18;
    MakeTrackerCalls(&local_168,(FieldDescriptor *)accessor_verifier.storage_.callback_buffer_,
                     &this->options_);
    absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
    Span<std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,void,std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,int>
              ((Span<google::protobuf::io::Printer::Sub_const> *)&local_150,&local_168);
    protobuf::io::Printer::WithVars
              ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
                *)local_140,pPVar1,local_150);
    std::
    vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ::~vector(&local_168);
    bVar2 = FieldDescriptor::is_repeated
                      ((FieldDescriptor *)accessor_verifier.storage_.callback_buffer_);
    pPVar1 = local_18;
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_178,
                 "\n        inline int $classname$::_internal_$name_internal$_size() const {\n          return _internal_$name_internal$().size();\n        }\n        inline int $classname$::$name$_size() const {\n          $WeakDescriptorSelfPin$;\n          $annotate_size$;\n          return _internal_$name_internal$_size();\n        }\n      "
                );
      protobuf::io::Printer::SourceLocation::current();
      protobuf::io::Printer::Emit(pPVar1,local_178._M_len,local_178._M_str);
    }
    else {
      pOVar3 = FieldDescriptor::real_containing_oneof
                         ((FieldDescriptor *)accessor_verifier.storage_.callback_buffer_);
      if (pOVar3 == (OneofDescriptor *)0x0) {
        GenerateSingularFieldHasBits
                  (this,(FieldDescriptor *)accessor_verifier.storage_.callback_buffer_,local_18);
      }
      else {
        GenerateOneofMemberHasBits
                  (this,(FieldDescriptor *)accessor_verifier.storage_.callback_buffer_,local_18);
      }
    }
    bVar2 = cpp::anon_unknown_0::IsCrossFileMaybeMap
                      ((FieldDescriptor *)accessor_verifier.storage_.callback_buffer_);
    if (!bVar2) {
      GenerateFieldClear(this,(FieldDescriptor *)accessor_verifier.storage_.callback_buffer_,true,
                         local_18);
    }
    this_00 = FieldGeneratorTable::get
                        (&this->field_generators_,
                         (FieldDescriptor *)accessor_verifier.storage_.callback_buffer_);
    FieldGenerator::GenerateInlineAccessorDefinitions(this_00,local_18);
    pPVar1 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_190,"\n");
    protobuf::io::Printer::SourceLocation::current();
    protobuf::io::Printer::Emit(pPVar1,local_190._M_len,local_190._M_str);
    absl::lts_20250127::
    Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
    ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
                *)local_140);
    absl::lts_20250127::
    Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
    ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
                *)local_100);
    absl::lts_20250127::
    Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:684:30)>
    ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:684:30)>
                *)local_78);
    protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator++
              ((Iterator *)&__end3.descriptor);
  }
  GenerateOneofHasBits(this,local_18);
  return;
}

Assistant:

void MessageGenerator::GenerateFieldAccessorDefinitions(io::Printer* p) {
  p->Emit("// $classname$\n\n");

  for (auto field : FieldRange(descriptor_)) {
    // We use a print listener to verify that the field generators properly add
    // the right annotations. This is only a verification step aimed to prevent
    // bugs where we have lack of test coverage. Note that this will verify the
    // annotations even when the particular feature is not on because we look at
    // the substitution variables, not the substitution result.
    // The check is a state machine that verifies that every substitution for
    // `name` is followed by one and only one for needed annotations. False
    // positives are accessors that are using $name$ for an internal name. For
    // those you can use $name_internal$ which is the same substitution but not
    // tracked by the verifier.
    const auto accessor_verifier =
        p->WithSubstitutionListener(AccessorVerifier(field));

    PrintFieldComment(Formatter{p}, field, options_);

    auto v = p->WithVars(FieldVars(field, options_));
    auto t = p->WithVars(MakeTrackerCalls(field, options_));
    if (field->is_repeated()) {
      p->Emit(R"cc(
        inline int $classname$::_internal_$name_internal$_size() const {
          return _internal_$name_internal$().size();
        }
        inline int $classname$::$name$_size() const {
          $WeakDescriptorSelfPin$;
          $annotate_size$;
          return _internal_$name_internal$_size();
        }
      )cc");
    } else if (field->real_containing_oneof()) {
      GenerateOneofMemberHasBits(field, p);
    } else {
      GenerateSingularFieldHasBits(field, p);
    }

    if (!IsCrossFileMaybeMap(field)) {
      GenerateFieldClear(field, true, p);
    }
    // Generate type-specific accessors.
    field_generators_.get(field).GenerateInlineAccessorDefinitions(p);

    p->Emit("\n");
  }

  GenerateOneofHasBits(p);
}